

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int ReadHuffmanCode(int alphabet_size,VP8LDecoder *dec,int *code_lengths,HuffmanTables *table)

{
  VP8LBitReader *br;
  byte bVar1;
  ushort uVar2;
  HuffmanCode *pHVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  uint local_cc;
  HuffmanTables local_b0;
  int code_length_code_lengths [19];
  
  br = &dec->br_;
  uVar4 = VP8LReadBits(br,1);
  uVar12 = 0;
  memset(code_lengths,0,(long)alphabet_size << 2);
  if (uVar4 == 0) {
    code_length_code_lengths[0x10] = 0;
    code_length_code_lengths[0x11] = 0;
    code_length_code_lengths[0x12] = 0;
    code_length_code_lengths[0xc] = 0;
    code_length_code_lengths[0xd] = 0;
    code_length_code_lengths[0xe] = 0;
    code_length_code_lengths[0xf] = 0;
    code_length_code_lengths[8] = 0;
    code_length_code_lengths[9] = 0;
    code_length_code_lengths[10] = 0;
    code_length_code_lengths[0xb] = 0;
    code_length_code_lengths[4] = 0;
    code_length_code_lengths[5] = 0;
    code_length_code_lengths[6] = 0;
    code_length_code_lengths[7] = 0;
    code_length_code_lengths[0] = 0;
    code_length_code_lengths[1] = 0;
    code_length_code_lengths[2] = 0;
    code_length_code_lengths[3] = 0;
    uVar4 = VP8LReadBits(br,4);
    uVar11 = (ulong)(uVar4 + 4);
    if ((int)(uVar4 + 4) < 1) {
      uVar11 = uVar12;
    }
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      uVar4 = VP8LReadBits(br,3);
      code_length_code_lengths["\x11\x12"[uVar12]] = uVar4;
    }
    iVar6 = VP8LHuffmanTablesAllocate(0x80,&local_b0);
    if ((iVar6 == 0) ||
       (iVar6 = VP8LBuildHuffmanTable(&local_b0,7,code_length_code_lengths,0x13), iVar6 == 0)) {
LAB_0010d196:
      VP8LHuffmanTablesDeallocate(&local_b0);
      if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
        dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      }
      goto LAB_0010d1b1;
    }
    uVar4 = VP8LReadBits(br,1);
    iVar6 = alphabet_size;
    if (uVar4 != 0) {
      uVar4 = VP8LReadBits(br,3);
      uVar4 = VP8LReadBits(br,uVar4 * 2 + 2);
      iVar6 = uVar4 + 2;
      if (alphabet_size < iVar6) goto LAB_0010d196;
    }
    iVar13 = 0;
    local_cc = 8;
    while ((iVar13 < alphabet_size && (bVar14 = iVar6 != 0, iVar6 = iVar6 + -1, bVar14))) {
      VP8LFillBitWindow(br);
      iVar7 = (dec->br_).bit_pos_;
      pHVar3 = (local_b0.curr_segment)->start;
      uVar9 = (uint)((dec->br_).val_ >> ((byte)iVar7 & 0x3f)) & 0x7f;
      (dec->br_).bit_pos_ = (uint)pHVar3[uVar9].bits + iVar7;
      uVar2 = pHVar3[uVar9].value;
      uVar9 = (uint)uVar2;
      if (uVar2 < 0x10) {
        iVar7 = iVar13 + 1;
        code_lengths[iVar13] = (uint)uVar2;
        iVar13 = iVar7;
        if (uVar9 != 0) {
          local_cc = uVar9;
        }
      }
      else {
        bVar1 = "\x03\x03\v"[uVar2 - 0x10];
        uVar4 = VP8LReadBits(br,(uint)"\x02\x03\a"[uVar2 - 0x10]);
        iVar7 = uVar4 + bVar1;
        if (alphabet_size < iVar7 + iVar13) goto LAB_0010d196;
        uVar8 = 0;
        if (uVar9 == 0x10) {
          uVar8 = local_cc;
        }
        puVar10 = (uint *)(code_lengths + iVar13);
        for (; 0 < iVar7; iVar7 = iVar7 + -1) {
          *puVar10 = uVar8;
          iVar13 = iVar13 + 1;
          puVar10 = puVar10 + 1;
        }
      }
    }
    VP8LHuffmanTablesDeallocate(&local_b0);
  }
  else {
    uVar4 = VP8LReadBits(br,1);
    uVar5 = VP8LReadBits(br,1);
    iVar6 = 8;
    if (uVar5 == 0) {
      iVar6 = 1;
    }
    uVar5 = VP8LReadBits(br,iVar6);
    code_lengths[(int)uVar5] = 1;
    if (uVar4 == 1) {
      uVar4 = VP8LReadBits(br,8);
      code_lengths[(int)uVar4] = 1;
    }
  }
  if (((dec->br_).eos_ == 0) &&
     (iVar6 = VP8LBuildHuffmanTable(table,8,code_lengths,alphabet_size), iVar6 != 0)) {
    return iVar6;
  }
LAB_0010d1b1:
  if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  }
  return 0;
}

Assistant:

static int ReadHuffmanCode(int alphabet_size, VP8LDecoder* const dec,
                           int* const code_lengths,
                           HuffmanTables* const table) {
  int ok = 0;
  int size = 0;
  VP8LBitReader* const br = &dec->br_;
  const int simple_code = VP8LReadBits(br, 1);

  memset(code_lengths, 0, alphabet_size * sizeof(*code_lengths));

  if (simple_code) {  // Read symbols, codes & code lengths directly.
    const int num_symbols = VP8LReadBits(br, 1) + 1;
    const int first_symbol_len_code = VP8LReadBits(br, 1);
    // The first code is either 1 bit or 8 bit code.
    int symbol = VP8LReadBits(br, (first_symbol_len_code == 0) ? 1 : 8);
    code_lengths[symbol] = 1;
    // The second code (if present), is always 8 bits long.
    if (num_symbols == 2) {
      symbol = VP8LReadBits(br, 8);
      code_lengths[symbol] = 1;
    }
    ok = 1;
  } else {  // Decode Huffman-coded code lengths.
    int i;
    int code_length_code_lengths[NUM_CODE_LENGTH_CODES] = { 0 };
    const int num_codes = VP8LReadBits(br, 4) + 4;
    assert(num_codes <= NUM_CODE_LENGTH_CODES);

    for (i = 0; i < num_codes; ++i) {
      code_length_code_lengths[kCodeLengthCodeOrder[i]] = VP8LReadBits(br, 3);
    }
    ok = ReadHuffmanCodeLengths(dec, code_length_code_lengths, alphabet_size,
                                code_lengths);
  }

  ok = ok && !br->eos_;
  if (ok) {
    size = VP8LBuildHuffmanTable(table, HUFFMAN_TABLE_BITS,
                                 code_lengths, alphabet_size);
  }
  if (!ok || size == 0) {
    return VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
  }
  return size;
}